

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O1

IndirOpnd * IR::IndirOpnd::New(RegOpnd *indexOpnd,int32 offset,byte scale,IRType type,Func *func)

{
  undefined1 *puVar1;
  IndirOpnd *this;
  
  this = (IndirOpnd *)new<Memory::JitArenaAllocator>(0x48,func->m_alloc,0x3f1274);
  (this->super_Opnd)._vptr_Opnd = (_func_int **)&PTR_DummyFunction_014ed940;
  ValueType::ValueType(&(this->super_Opnd).m_valueType);
  puVar1 = &(this->super_Opnd).field_0xb;
  *puVar1 = *puVar1 & 8;
  (this->super_Opnd).m_kind = OpndKindInvalid;
  (this->super_Opnd).isDeleted = false;
  (this->super_Opnd)._vptr_Opnd = (_func_int **)&PTR_DummyFunction_014ed8b8;
  (this->super_Opnd).field_0xe = 0;
  this->m_baseOpnd = (RegOpnd *)0x0;
  this->m_indexOpnd = (RegOpnd *)0x0;
  *(undefined8 *)((long)&this->m_indexOpnd + 5) = 0;
  this->m_func = (Func *)0x0;
  this->m_desc = (char16 *)0x0;
  this->m_addrKind = ~AddrOpndKindConstantAddress;
  this->m_func = func;
  SetBaseOpnd(this,(RegOpnd *)0x0);
  this->m_offset = offset;
  (this->super_Opnd).field_0xe = 1;
  SetIndexOpnd(this,indexOpnd);
  (this->super_Opnd).m_type = type;
  puVar1 = &(this->super_Opnd).field_0xb;
  *puVar1 = *puVar1 & 0xf7;
  (this->super_Opnd).m_kind = OpndKindIndir;
  this->m_scale = scale;
  return this;
}

Assistant:

IndirOpnd *
IndirOpnd::New(RegOpnd *indexOpnd, int32 offset, byte scale, IRType type, Func *func)
{
    IndirOpnd * indirOpnd;

    indirOpnd = JitAnew(func->m_alloc, IndirOpnd);

    indirOpnd->m_func = func;
    indirOpnd->SetBaseOpnd(nullptr);
    indirOpnd->SetOffset(offset, true);
    indirOpnd->SetIndexOpnd(indexOpnd);
    indirOpnd->m_type = type;
    indirOpnd->SetIsJITOptimizedReg(false);

    indirOpnd->m_kind = OpndKindIndir;

    indirOpnd->m_scale = scale;

    return indirOpnd;
}